

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall chrono::ChNodeSPH::ChNodeSPH(ChNodeSPH *this,void **vtt)

{
  ChLoadableUVW CVar1;
  ChCollisionModelBullet *this_00;
  double dVar2;
  
  ChNodeXYZ::ChNodeXYZ(&this->super_ChNodeXYZ,vtt + 1);
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined ***)&(this->super_ChNodeXYZ).field_0x50 = &PTR__ChContactable_1vars_00b37c10;
  *(undefined ***)&this->field_0x68 = &PTR__ChContactable_1vars_00b37cb8;
  CVar1 = (ChLoadableUVW)*vtt;
  (this->super_ChNodeXYZ).super_ChLoadableUVW = CVar1;
  *(void **)((long)(this->super_ChNodeXYZ).pos.m_data + *(long *)((long)CVar1 + -0x80) + -8) =
       vtt[6];
  *(void **)((long)(this->super_ChNodeXYZ).pos.m_data +
            *(long *)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + -0x78) + -8) = vtt[7];
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x50 = 0xb372f8;
  *(undefined8 *)&this->field_0x68 = 0xb373a0;
  this->container = (ChMatterSPH *)0x0;
  ChVariablesNode::ChVariablesNode(&this->variables);
  (this->UserForce).m_data[0] = VNULL;
  (this->UserForce).m_data[1] = DAT_00b90ac0;
  (this->UserForce).m_data[2] = DAT_00b90ac8;
  this->volume = 0.01;
  this->h_rad = 0.1;
  this->coll_rad = 0.001;
  this->pressure = 0.0;
  this_00 = (ChCollisionModelBullet *)::operator_new(0x68);
  collision::ChCollisionModelBullet::ChCollisionModelBullet(this_00);
  this->collision_model = (ChCollisionModel *)this_00;
  (*(this_00->super_ChCollisionModel)._vptr_ChCollisionModel[0x16])
            (this_00,&(this->super_ChNodeXYZ).field_0x50);
  (**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x98))(0x3f847ae147ae147b,this);
  dVar2 = (double)(**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))(this);
  this->density = dVar2 / this->volume;
  return;
}

Assistant:

ChNodeSPH::ChNodeSPH() : container(nullptr), UserForce(VNULL), volume(0.01), h_rad(0.1), coll_rad(0.001), pressure(0) {
    collision_model = new ChCollisionModelBullet;
    collision_model->SetContactable(this);

    SetMass(0.01);
    density = GetMass() / volume;
}